

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

void __thiscall MutableBuffer::push<short>(MutableBuffer *this,short value,size_t count)

{
  EndianessMode EVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  short sVar5;
  long lVar6;
  short *psVar7;
  anon_union_2_2_7f9ed247 dest;
  anon_union_2_2_7f9ed247 source;
  short local_1c;
  short local_1a;
  
  check_size(this,count * 2 + (this->super_Buffer).size);
  if (count != 0) {
    pvVar2 = (this->super_Buffer).data;
    sVar3 = (this->super_Buffer).size;
    EVar1 = (this->super_Buffer).endianess;
    sVar4 = 0;
    do {
      sVar5 = value;
      if (EVar1 == EndianessBig) {
        local_1a = value;
        lVar6 = 1;
        psVar7 = &local_1c;
        do {
          *(undefined1 *)psVar7 = *(undefined1 *)((long)&local_1a + lVar6);
          psVar7 = (short *)((long)psVar7 + 1);
          lVar6 = lVar6 + -1;
          sVar5 = local_1c;
        } while (lVar6 == 0);
      }
      *(short *)((long)pvVar2 + sVar3) = sVar5;
      sVar3 = sVar3 + 2;
      sVar4 = sVar4 + 1;
    } while (sVar4 != count);
    (this->super_Buffer).size = sVar3;
  }
  return;
}

Assistant:

void push(T value, size_t count = 1) {
    check_size(size + (sizeof(T) * count));
    for (size_t i = 0; i < count; i++) {
      *(reinterpret_cast<T*>(offset(size))) = (endianess == EndianessBig) ?
                                                htobe(value) :
                                                htole(value);
      size += sizeof(T);
    }
  }